

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_6be18a::TransformSelectorRegex::TransformSelectorRegex
          (TransformSelectorRegex *this,string *regex)

{
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *regex_local;
  TransformSelectorRegex *this_local;
  
  local_18 = regex;
  regex_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"REGEX",&local_39);
  TransformSelector::TransformSelector(&this->super_TransformSelector,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_TransformSelector)._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelectorRegex_00faeef0;
  cmsys::RegularExpression::RegularExpression(&this->Regex,local_18);
  return;
}

Assistant:

TransformSelectorRegex(const std::string& regex)
    : TransformSelector("REGEX")
    , Regex(regex)
  {
  }